

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O1

void __thiscall sfc::Subpalette::set(Subpalette *this,uint index,rgba_t color)

{
  _Rb_tree_header *p_Var1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_40;
  
  __first._M_current =
       (this->_colors).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->_colors).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((ulong)index < (ulong)((long)__last._M_current - (long)__first._M_current >> 2)) {
    __first._M_current[index] = color;
    std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
    set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_40,
               __first,__last);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::clear(&(this->_colors_set)._M_t);
    if (local_40._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &local_40._M_impl.super__Rb_tree_header;
      (this->_colors_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_40._M_impl.super__Rb_tree_header._M_header._M_color;
      (this->_colors_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_40._M_impl.super__Rb_tree_header._M_header._M_parent;
      (this->_colors_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_40._M_impl.super__Rb_tree_header._M_header._M_left;
      (this->_colors_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_40._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_40._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(this->_colors_set)._M_t._M_impl.super__Rb_tree_header._M_header;
      (this->_colors_set)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_40._M_impl.super__Rb_tree_header._M_node_count;
      local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_40._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_40._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_40);
  }
  return;
}

Assistant:

void Subpalette::set(unsigned index, const rgba_t color) {
  if (_colors.size() > index) {
    _colors[index] = color;
    _colors_set = rgba_set_t(_colors.begin(), _colors.end());
  }
}